

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_7::Validator::OnReturnCallIndirectExpr
          (Validator *this,ReturnCallIndirectExpr *expr)

{
  bool bVar1;
  ReturnCallIndirectExpr *expr_local;
  Validator *this_local;
  
  this->expr_loc_ = &(expr->super_ExprMixin<(wabt::ExprType)33>).super_Expr.loc;
  bVar1 = std::vector<wabt::Table_*,_std::allocator<wabt::Table_*>_>::empty
                    (&this->current_module_->tables);
  if (bVar1) {
    PrintError(this,&(expr->super_ExprMixin<(wabt::ExprType)33>).super_Expr.loc,
               "found return_call_indirect operator, but no table");
  }
  CheckFuncSignature(this,&(expr->super_ExprMixin<(wabt::ExprType)33>).super_Expr.loc,&expr->decl);
  TypeChecker::OnReturnCallIndirect
            (&this->typechecker_,&(expr->decl).sig.param_types,&(expr->decl).sig.result_types);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result Validator::OnReturnCallIndirectExpr(ReturnCallIndirectExpr* expr) {
  expr_loc_ = &expr->loc;
  if (current_module_->tables.empty()) {
    PrintError(&expr->loc, "found return_call_indirect operator, but no table");
  }
  CheckFuncSignature(&expr->loc, expr->decl);
  typechecker_.OnReturnCallIndirect(expr->decl.sig.param_types,
                              expr->decl.sig.result_types);
  return Result::Ok;
}